

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QString * __thiscall QDateTime::timeZoneAbbreviation(QDateTime *this)

{
  long lVar1;
  QLatin1StringView latin1;
  bool bVar2;
  TimeSpec TVar3;
  ulong uVar4;
  Data *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff38;
  QFlagsStorage<QDateTimePrivate::StatusFlag> in_stack_ffffffffffffff3c;
  QDateTimeData *in_stack_ffffffffffffff40;
  QLatin1String *in_stack_ffffffffffffff48;
  QString *in_stack_ffffffffffffff50;
  DateFormat format;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  DaylightStatus in_stack_ffffffffffffff84;
  qint64 millis;
  undefined1 in_stack_ffffffffffffff88 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isValid((QDateTime *)&in_stack_ffffffffffffff40->data);
  if (bVar2) {
    TVar3 = getSpec(in_stack_ffffffffffffff40);
    millis = in_stack_ffffffffffffff88._0_8_;
    uVar4 = (ulong)TVar3;
    switch(uVar4) {
    case 0:
      getMSecs((QDateTimeData *)CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38));
      getStatus(in_stack_ffffffffffffff40);
      extractDaylightStatus((StatusFlags)in_stack_ffffffffffffff3c.i);
      QDateTimePrivate::localNameAtMillis(millis,in_stack_ffffffffffffff84);
      break;
    case 1:
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
      latin1.m_data._0_4_ = in_stack_ffffffffffffff78;
      latin1.m_size = (qsizetype)in_RSI;
      latin1.m_data._4_4_ = in_stack_ffffffffffffff7c;
      QString::QString(in_stack_ffffffffffffff50,latin1);
      break;
    case 2:
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
      format = (DateFormat)(uVar4 >> 0x20);
      Data::operator->(in_RSI);
      toOffsetString(format,(int)((ulong)in_RDI >> 0x20));
      ::operator+(in_stack_ffffffffffffff48,(QString *)&in_stack_ffffffffffffff40->data);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QLatin1String,_QString> *)
                 CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38));
      QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                ((QStringBuilder<QLatin1String,_QString> *)0x56ef08);
      QString::~QString((QString *)0x56ef12);
      break;
    case 3:
      Data::operator->(in_RSI);
      QTimeZone::abbreviation(in_stack_ffffffffffffff88._8_8_,in_stack_ffffffffffffff88._0_8_);
      break;
    default:
      QString::QString((QString *)0x56efbe);
    }
  }
  else {
    QString::QString((QString *)0x56ee20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QDateTime::timeZoneAbbreviation() const
{
    if (!isValid())
        return QString();

    switch (getSpec(d)) {
    case Qt::UTC:
        return "UTC"_L1;
    case Qt::OffsetFromUTC:
        return "UTC"_L1 + toOffsetString(Qt::ISODate, d->m_offsetFromUtc);
    case Qt::TimeZone:
#if !QT_CONFIG(timezone)
        break;
#else
        Q_ASSERT(d->m_timeZone.isValid());
        return d->m_timeZone.abbreviation(*this);
#endif // timezone
    case Qt::LocalTime:
#if defined(Q_OS_WIN) && QT_CONFIG(timezone)
        // MS's tzname is a full MS-name, not an abbreviation:
        if (QString sys = QTimeZone::systemTimeZone().abbreviation(*this); !sys.isEmpty())
            return sys;
        // ... but, even so, a full name isn't as bad as empty.
#endif
        return QDateTimePrivate::localNameAtMillis(getMSecs(d),
                                                   extractDaylightStatus(getStatus(d)));
    }
    return QString();
}